

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall Parse::Object::setAttach(Object *this,string *anchor,string *coordN)

{
  bool bVar1;
  Attach *this_00;
  
  if (this->attach == (Attach *)0x0) {
    this_00 = (Attach *)operator_new(0x80);
    (this_00->top)._M_dataplus._M_p = (pointer)0x0;
    (this_00->top)._M_string_length = 0;
    (this_00->top).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->top).field_2 + 8) = 0;
    (this_00->bottom)._M_dataplus._M_p = (pointer)0x0;
    (this_00->bottom)._M_string_length = 0;
    (this_00->bottom).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->bottom).field_2 + 8) = 0;
    (this_00->left)._M_dataplus._M_p = (pointer)0x0;
    (this_00->left)._M_string_length = 0;
    (this_00->left).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->left).field_2 + 8) = 0;
    (this_00->right)._M_dataplus._M_p = (pointer)0x0;
    (this_00->right)._M_string_length = 0;
    (this_00->right).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->right).field_2 + 8) = 0;
    Attach::Attach(this_00);
    this->attach = this_00;
  }
  bVar1 = std::operator==(anchor,"left_attach");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->attach->left);
  }
  bVar1 = std::operator==(anchor,"right_attach");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->attach->right);
  }
  bVar1 = std::operator==(anchor,"top_attach");
  if (bVar1) {
    std::__cxx11::string::assign((char *)this->attach);
  }
  bVar1 = std::operator==(anchor,"bottom_attach");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->attach->bottom);
    return;
  }
  return;
}

Assistant:

void setAttach(std::string anchor, std::string coordN) {
                if (attach == NULL) {
                    attach = new Attach();
                }
                if (anchor == "left_attach") {
                    attach->left = (coordN.c_str());
                }
                if (anchor == "right_attach") {
                    attach->right = (coordN.c_str());
                }
                if (anchor == "top_attach") {
                    attach->top = (coordN.c_str());
                }
                if (anchor == "bottom_attach") {
                    attach->bottom = (coordN.c_str());
                }
            }